

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdir-posix.c
# Opt level: O0

PDir * p_dir_new(pchar *path,PError **error)

{
  long lVar1;
  PErrorIO code;
  pint native_code;
  DIR *__dirp;
  pchar *ppVar2;
  size_t sVar3;
  char *pcVar4;
  pchar *pathp;
  DIR *dir;
  PDir *ret;
  PError **error_local;
  pchar *path_local;
  
  if (path == (pchar *)0x0) {
    p_error_set_error_p(error,0x1fb,0,"Invalid input argument");
    path_local = (pchar *)0x0;
  }
  else {
    __dirp = opendir(path);
    if (__dirp == (DIR *)0x0) {
      code = p_error_get_last_io();
      native_code = p_error_get_last_system();
      p_error_set_error_p(error,code,native_code,"Failed to call opendir() to open directory stream"
                         );
      path_local = (pchar *)0x0;
    }
    else {
      path_local = (pchar *)p_malloc0(0x20);
      if (path_local == (pchar *)0x0) {
        p_error_set_error_p(error,0x1f5,0,"Failed to allocate memory for directory structure");
        closedir(__dirp);
        path_local = (pchar *)0x0;
      }
      else {
        *(DIR **)path_local = __dirp;
        ppVar2 = p_strdup(path);
        *(pchar **)(path_local + 0x10) = ppVar2;
        ppVar2 = p_strdup(path);
        *(pchar **)(path_local + 0x18) = ppVar2;
        lVar1 = *(long *)(path_local + 0x10);
        sVar3 = strlen(*(char **)(path_local + 0x10));
        pcVar4 = (char *)(lVar1 + sVar3 + -1);
        if ((*pcVar4 == '/') || (*pcVar4 == '\\')) {
          *pcVar4 = '\0';
        }
      }
    }
  }
  return (PDir *)path_local;
}

Assistant:

P_LIB_API PDir *
p_dir_new (const pchar	*path,
	   PError	**error)
{
	PDir	*ret;
	DIR	*dir;
	pchar	*pathp;

	if (P_UNLIKELY (path == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return NULL;
	}

	if (P_UNLIKELY ((dir = opendir (path)) == NULL)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_last_io (),
				     p_error_get_last_system (),
				     "Failed to call opendir() to open directory stream");
		return NULL;
	}

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PDir))) == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_NO_RESOURCES,
				     0,
				     "Failed to allocate memory for directory structure");
		closedir (dir);
		return NULL;
	}

	ret->dir       = dir;
	ret->path      = p_strdup (path);
	ret->orig_path = p_strdup (path);

	pathp = ret->path + strlen (ret->path) - 1;

	if (*pathp == '/' || *pathp == '\\')
		*pathp = '\0';

	return ret;
}